

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O2

bool __thiscall CEditor::PopupNewFolder(CEditor *this,void *pContext,CUIRect View)

{
  CUI *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  char *pText;
  int *pID;
  CUIRect *pRight;
  long in_FS_OFFSET;
  CUIRect ButtonBar;
  CUIRect Label;
  CUIRect View_local;
  char aBuf [512];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  View_local = View;
  CUIRect::HSplitTop(&View_local,10.0,(CUIRect *)0x0,&View_local);
  CUIRect::HSplitTop(&View_local,30.0,&Label,&View_local);
  this_00 = &this->m_UI;
  CUI::DoLabel(this_00,&Label,"Create new folder",20.0,1,-1.0,true);
  CUIRect::HSplitBottom(&View_local,10.0,&View_local,(CUIRect *)0x0);
  CUIRect::HSplitBottom(&View_local,20.0,&View_local,&ButtonBar);
  if (this->m_aFileDialogErrString[0] == '\0') {
    CUIRect::HSplitBottom(&View_local,40.0,&View_local,(CUIRect *)0x0);
    CUIRect::VMargin(&View_local,40.0,&View_local);
    CUIRect::HSplitBottom(&View_local,20.0,&View_local,&Label);
    if (PopupNewFolder(void*,CUIRect)::s_FolderInput == '\0') {
      iVar3 = __cxa_guard_acquire(&PopupNewFolder(void*,CUIRect)::s_FolderInput);
      if (iVar3 != 0) {
        CLineInput::CLineInput(&PopupNewFolder::s_FolderInput,this->m_aFileDialogNewFolderName,0x40)
        ;
        __cxa_atexit(CLineInput::~CLineInput,&PopupNewFolder::s_FolderInput,&__dso_handle);
        __cxa_guard_release(&PopupNewFolder(void*,CUIRect)::s_FolderInput);
      }
    }
    DoEditBox(this,&PopupNewFolder::s_FolderInput,&Label,15.0);
    CUIRect::HSplitBottom(&View_local,20.0,&View_local,&Label);
    CUI::DoLabel(this_00,&Label,"Name:",10.0,0,-1.0,true);
    CUIRect::VSplitLeft(&ButtonBar,30.0,(CUIRect *)0x0,&ButtonBar);
    CUIRect::VSplitLeft(&ButtonBar,110.0,&Label,&ButtonBar);
    iVar3 = DoButton_Editor(this,&PopupNewFolder::s_CreateButton,"Create",0,&Label,0,(char *)0x0);
    if ((iVar3 != 0) && (this->m_aFileDialogNewFolderName[0] != '\0')) {
      str_format(aBuf,0x200,"%s/%s",this->m_pFileDialogPath,this->m_aFileDialogNewFolderName);
      iVar3 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[0xb])(this->m_pStorage,aBuf,0)
      ;
      if ((char)iVar3 != '\0') {
        FilelistPopulate(this,0);
        bVar2 = true;
        goto LAB_0019a376;
      }
      str_copy(this->m_aFileDialogErrString,"Unable to create the folder",0x40);
    }
    CUIRect::VSplitRight(&ButtonBar,30.0,&ButtonBar,(CUIRect *)0x0);
    pRight = &Label;
    CUIRect::VSplitRight(&ButtonBar,110.0,&ButtonBar,pRight);
    pID = &PopupNewFolder::s_AbortButton;
    pText = "Abort";
  }
  else {
    CUIRect::HSplitTop(&View_local,30.0,(CUIRect *)0x0,&View_local);
    CUIRect::VMargin(&View_local,40.0,&View_local);
    CUIRect::HSplitTop(&View_local,20.0,&Label,&View_local);
    CUI::DoLabel(this_00,&Label,"Error:",10.0,0,-1.0,true);
    CUIRect::HSplitTop(&View_local,20.0,&Label,&View_local);
    CUI::DoLabel(this_00,&Label,"Unable to create the folder",10.0,0,View_local.w,true);
    pRight = &ButtonBar;
    CUIRect::VMargin(pRight,ButtonBar.w * 0.5 + -55.0,pRight);
    pID = &PopupNewFolder(void*,CUIRect)::s_CreateButton;
    pText = "Ok";
  }
  iVar3 = DoButton_Editor(this,pID,pText,0,pRight,0,(char *)0x0);
  bVar2 = true;
  if (iVar3 == 0) {
    bVar2 = false;
  }
LAB_0019a376:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CEditor::PopupNewFolder(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect Label, ButtonBar;

	// title
	View.HSplitTop(10.0f, 0, &View);
	View.HSplitTop(30.0f, &Label, &View);
	pEditor->UI()->DoLabel(&Label, "Create new folder", 20.0f, TEXTALIGN_CENTER);

	View.HSplitBottom(10.0f, &View, 0);
	View.HSplitBottom(20.0f, &View, &ButtonBar);

	if(pEditor->m_aFileDialogErrString[0] == 0)
	{
		// interaction box
		View.HSplitBottom(40.0f, &View, 0);
		View.VMargin(40.0f, &View);
		View.HSplitBottom(20.0f, &View, &Label);
		static CLineInput s_FolderInput(pEditor->m_aFileDialogNewFolderName, sizeof(pEditor->m_aFileDialogNewFolderName));
		pEditor->DoEditBox(&s_FolderInput, &Label, 15.0f);
		View.HSplitBottom(20.0f, &View, &Label);
		pEditor->UI()->DoLabel(&Label, "Name:", 10.0f, TEXTALIGN_LEFT);

		// button bar
		ButtonBar.VSplitLeft(30.0f, 0, &ButtonBar);
		ButtonBar.VSplitLeft(110.0f, &Label, &ButtonBar);
		static int s_CreateButton = 0;
		if(pEditor->DoButton_Editor(&s_CreateButton, "Create", 0, &Label, 0, 0))
		{
			// create the folder
			if(pEditor->m_aFileDialogNewFolderName[0])
			{
				char aBuf[IO_MAX_PATH_LENGTH];
				str_format(aBuf, sizeof(aBuf), "%s/%s", pEditor->m_pFileDialogPath, pEditor->m_aFileDialogNewFolderName);
				if(pEditor->Storage()->CreateFolder(aBuf, IStorage::TYPE_SAVE))
				{
					pEditor->FilelistPopulate(IStorage::TYPE_SAVE);
					return true;
				}
				else
					str_copy(pEditor->m_aFileDialogErrString, "Unable to create the folder", sizeof(pEditor->m_aFileDialogErrString));
			}
		}
		ButtonBar.VSplitRight(30.0f, &ButtonBar, 0);
		ButtonBar.VSplitRight(110.0f, &ButtonBar, &Label);
		static int s_AbortButton = 0;
		if(pEditor->DoButton_Editor(&s_AbortButton, "Abort", 0, &Label, 0, 0))
			return true;
	}
	else
	{
		// error text
		View.HSplitTop(30.0f, 0, &View);
		View.VMargin(40.0f, &View);
		View.HSplitTop(20.0f, &Label, &View);
		pEditor->UI()->DoLabel(&Label, "Error:", 10.0f, TEXTALIGN_LEFT);
		View.HSplitTop(20.0f, &Label, &View);
		pEditor->UI()->DoLabel(&Label, "Unable to create the folder", 10.0f, TEXTALIGN_LEFT, View.w);

		// button
		ButtonBar.VMargin(ButtonBar.w/2.0f-55.0f, &ButtonBar);
		static int s_CreateButton = 0;
		if(pEditor->DoButton_Editor(&s_CreateButton, "Ok", 0, &ButtonBar, 0, 0))
			return true;
	}

	return false;
}